

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_types.cpp
# Opt level: O0

void BanMapFromJson(UniValue *bans_json,banmap_t *bans)

{
  long lVar1;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar2;
  int iVar3;
  reference pUVar4;
  key_type *in_RSI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_>,_bool> pVar5;
  string *subnet_str;
  UniValue *ban_entry_json;
  vector<UniValue,_std::allocator<UniValue>_> *__range1;
  int version;
  const_iterator __end1;
  const_iterator __begin1;
  CSubNet subnet;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  ConstevalFormatString<1U> in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  _Rb_tree_iterator<std::pair<const_CSubNet,_CBanEntry>_> in_stack_fffffffffffffe38;
  key_type *__k;
  allocator<char> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  string *in_stack_fffffffffffffe58;
  UniValue *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe70;
  allocator<char> *in_stack_fffffffffffffe78;
  string *subnet_str_00;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  ConstevalFormatString<1U> in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  allocator<char> local_c9 [36];
  string local_a5;
  allocator<char> local_80 [48];
  Level in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::getValues((UniValue *)in_stack_fffffffffffffe38._M_node);
  local_a5._13_8_ =
       std::vector<UniValue,_std::allocator<UniValue>_>::begin
                 ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffe10);
  local_a5._5_8_ =
       std::vector<UniValue,_std::allocator<UniValue>_>::end
                 ((vector<UniValue,_std::allocator<UniValue>_> *)in_stack_fffffffffffffe10);
  while (bVar2 = __gnu_cxx::
                 operator==<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                           ((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffffe18.fmt,
                            (__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                             *)in_stack_fffffffffffffe10), ((bVar2 ^ 0xffU) & 1) != 0) {
    pUVar4 = __gnu_cxx::
             __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
             ::operator*((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    subnet_str_00 = &local_a5;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe58,
               (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48);
    UniValue::operator[]
              ((UniValue *)in_stack_fffffffffffffe18.fmt,(string *)in_stack_fffffffffffffe10);
    iVar3 = UniValue::getInt<int>(in_stack_fffffffffffffe60);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    std::allocator<char>::~allocator((allocator<char> *)&local_a5);
    local_a5._M_dataplus._M_p._1_4_ = iVar3;
    if (iVar3 == 1) {
      in_stack_fffffffffffffe78 = local_c9;
      in_stack_fffffffffffffe70 = BANMAN_JSON_ADDR_KEY;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe58,
                 (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
                 in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe60 =
           UniValue::operator[]
                     ((UniValue *)in_stack_fffffffffffffe18.fmt,(string *)in_stack_fffffffffffffe10)
      ;
      in_stack_fffffffffffffe58 =
           UniValue::get_str_abi_cxx11_((UniValue *)in_stack_fffffffffffffe10);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      std::allocator<char>::~allocator(local_c9);
      in_stack_fffffffffffffe48 = local_80;
      in_stack_fffffffffffffeb8.fmt = (char *)in_stack_fffffffffffffe58;
      LookupSubNet(subnet_str_00);
      in_stack_fffffffffffffe57 =
           CSubNet::IsValid((CSubNet *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08)
                           );
      if ((bool)in_stack_fffffffffffffe57) {
        __k = in_RSI;
        CBanEntry::CBanEntry
                  ((CBanEntry *)in_stack_fffffffffffffeb0,
                   (UniValue *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
        pVar5 = std::
                map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                ::insert_or_assign<CBanEntry>
                          ((map<CSubNet,_CBanEntry,_std::less<CSubNet>,_std::allocator<std::pair<const_CSubNet,_CBanEntry>_>_>
                            *)in_stack_fffffffffffffe48,__k,
                           (CBanEntry *)in_stack_fffffffffffffe38._M_node);
        in_stack_fffffffffffffe38 = pVar5.first._M_node;
        local_a5.field_2._M_local_buf[0xd] = pVar5.second;
        in_stack_fffffffffffffeac = 0;
        local_a5.field_2._5_8_ = in_stack_fffffffffffffe38._M_node;
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        in_stack_fffffffffffffe18.fmt = in_stack_fffffffffffffeb8.fmt;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
        in_stack_fffffffffffffeb0 =
             "Dropping entry with unparseable address or subnet (%s) from ban list\n";
        in_stack_fffffffffffffe10 =
             "Dropping entry with unparseable address or subnet (%s) from ban list\n";
        in_stack_fffffffffffffe08 = 2;
        logging_function_00._M_str = (char *)pUVar4;
        logging_function_00._M_len = in_stack_fffffffffffffed0;
        source_file_00._M_str = in_stack_fffffffffffffec8;
        source_file_00._M_len = (size_t)in_stack_fffffffffffffec0;
        in_stack_fffffffffffffeb8.fmt = in_stack_fffffffffffffe18.fmt;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_00,source_file_00,
                   (int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                   (LogFlags)in_stack_fffffffffffffe70,in_stack_ffffffffffffffb0,
                   in_stack_fffffffffffffe18,in_stack_ffffffffffffffc0);
        in_stack_fffffffffffffeac = 3;
      }
      CSubNet::~CSubNet((CSubNet *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
      in_stack_fffffffffffffec0 = "Dropping entry with unknown version (%s) from ban list\n";
      in_stack_fffffffffffffe18.fmt = (char *)((long)&local_a5._M_dataplus._M_p + 1);
      in_stack_fffffffffffffe08 = 2;
      in_stack_fffffffffffffe10 = "Dropping entry with unknown version (%s) from ban list\n";
      logging_function._M_str = (char *)pUVar4;
      logging_function._M_len = in_stack_fffffffffffffed0;
      source_file._M_str = in_stack_fffffffffffffec8;
      source_file._M_len = (size_t)"Dropping entry with unknown version (%s) from ban list\n";
      LogPrintFormatInternal<int>
                (logging_function,source_file,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20),
                 (LogFlags)in_stack_fffffffffffffe70,in_stack_ffffffffffffffb0,
                 in_stack_fffffffffffffeb8,(int *)in_stack_ffffffffffffffc0);
    }
    __gnu_cxx::
    __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
    operator++((__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void BanMapFromJson(const UniValue& bans_json, banmap_t& bans)
{
    for (const auto& ban_entry_json : bans_json.getValues()) {
        const int version{ban_entry_json[BANMAN_JSON_VERSION_KEY].getInt<int>()};
        if (version != CBanEntry::CURRENT_VERSION) {
            LogPrintf("Dropping entry with unknown version (%s) from ban list\n", version);
            continue;
        }
        const auto& subnet_str = ban_entry_json[BANMAN_JSON_ADDR_KEY].get_str();
        const CSubNet subnet{LookupSubNet(subnet_str)};
        if (!subnet.IsValid()) {
            LogPrintf("Dropping entry with unparseable address or subnet (%s) from ban list\n", subnet_str);
            continue;
        }
        bans.insert_or_assign(subnet, CBanEntry{ban_entry_json});
    }
}